

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

char * preprocessor_nexttoken(Preprocessor *ctx,uint *len,Token *token)

{
  Preprocessor *__s;
  IncludeState *pIVar1;
  int *piVar2;
  Conditional *pCVar3;
  bool bVar4;
  byte bVar5;
  Token TVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  Conditional *pCVar11;
  char *__s1;
  Buffer *buffer;
  size_t sVar12;
  Define *pDVar13;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  IncludeState *pIVar19;
  undefined8 *puVar20;
  ulong uVar21;
  Preprocessor *pPVar22;
  Preprocessor *pPVar23;
  bool bVar24;
  byte bVar25;
  char *local_e8;
  char **local_e0;
  undefined8 local_98 [13];
  
  bVar25 = 0;
  __s = ctx + 8;
LAB_0013207f:
  do {
    if (*(int *)ctx != 0) {
      *(undefined4 *)ctx = 0;
      *token = TOKEN_PREPROCESSING_ERROR;
      sVar14 = strlen((char *)__s);
      *len = (uint)sVar14;
      return (char *)__s;
    }
    pIVar1 = *(IncludeState **)(ctx + 0x120);
    if (pIVar1 == (IncludeState *)0x0) {
      *token = TOKEN_EOI;
      *len = 0;
      return (char *)0x0;
    }
    if (pIVar1->conditional_stack == (Conditional *)0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = pIVar1->conditional_stack->skipping != 0;
    }
    TVar6 = lexer(pIVar1);
    if (TVar6 == TOKEN_IDENTIFIER) {
switchD_00132114_caseD_11e:
      if (!bVar24) {
        switch(TVar6) {
        case TOKEN_PP_INCLUDE:
          handle_pp_include((Context_conflict1 *)ctx);
          goto LAB_0013207f;
        case TOKEN_PP_LINE:
          handle_pp_line((Context_conflict1 *)ctx);
          goto LAB_0013207f;
        case TOKEN_PP_DEFINE:
          pIVar1 = *(IncludeState **)(ctx + 0x120);
          TVar6 = lexer(pIVar1);
          if (TVar6 == TOKEN_IDENTIFIER) {
            __s1 = (char *)(**(code **)(ctx + 0x960))
                                     (pIVar1->tokenlen + 1,*(undefined8 *)(ctx + 0x970));
            if (__s1 == (char *)0x0) {
              *(undefined4 *)(ctx + 4) = 1;
            }
            else {
              memcpy(__s1,pIVar1->token,(ulong)pIVar1->tokenlen);
              __s1[pIVar1->tokenlen] = '\0';
              iVar7 = strcmp(__s1,"defined");
              if (iVar7 != 0) {
                iVar7 = strcmp(__s1,"__FILE__");
                pPVar22 = ctx + 0x938;
                if (((iVar7 == 0) ||
                    (iVar7 = strcmp(__s1,"__LINE__"), pPVar22 = ctx + 0x940, iVar7 == 0)) &&
                   (*(long *)pPVar22 != 0)) {
                  failf((Context_conflict1 *)ctx,"\'%s\' already defined",__s1);
                  free_define((Context_conflict1 *)ctx,*(Define **)pPVar22);
                  *(long *)pPVar22 = 0;
                }
                pIVar1->report_whitespace = 1;
                lexer(pIVar1);
                pIVar1->report_whitespace = 0;
                if (pIVar1->tokenval != 0x28) {
                  if (pIVar1->tokenval == 0x20) {
                    lexer(pIVar1);
                  }
                  iVar7 = 0;
                  local_e0 = (char **)0x0;
                  goto LAB_00132676;
                }
                pIVar19 = pIVar1;
                puVar20 = local_98;
                for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
                  *puVar20 = pIVar19->filename;
                  pIVar19 = (IncludeState *)((long)pIVar19 + (ulong)bVar25 * -0x10 + 8);
                  puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
                }
                uVar16 = 0;
                do {
                  TVar6 = lexer(pIVar1);
                  if (TVar6 != TOKEN_IDENTIFIER) break;
                  uVar16 = (ulong)((int)uVar16 + 1);
                  TVar6 = lexer(pIVar1);
                } while (TVar6 == 0x2c);
                iVar7 = (int)uVar16;
                if (pIVar1->tokenval == 0x29) {
                  if (iVar7 == 0) {
                    iVar7 = -1;
                    local_e0 = (char **)0x0;
                  }
                  else {
                    local_e0 = (char **)(**(code **)(ctx + 0x960))
                                                  ((long)iVar7 << 3 & 0xffffffff,
                                                   *(undefined8 *)(ctx + 0x970));
                    if (local_e0 == (char **)0x0) {
                      *(undefined4 *)(ctx + 4) = 1;
                      goto LAB_00132916;
                    }
                    puVar20 = local_98;
                    pIVar19 = pIVar1;
                    for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
                      pIVar19->filename = (char *)*puVar20;
                      puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
                      pIVar19 = (IncludeState *)((long)pIVar19 + (ulong)bVar25 * -0x10 + 8);
                    }
                    memset(local_e0,0,(long)iVar7 << 3);
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      lexer(pIVar1);
                      if (pIVar1->tokenval != TOKEN_IDENTIFIER) {
                        __assert_fail("state->tokenval == TOKEN_IDENTIFIER",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                      ,0x3ff,"void handle_pp_define(Context *)");
                      }
                      pcVar18 = (char *)(**(code **)(ctx + 0x960))
                                                  (pIVar1->tokenlen + 1,*(undefined8 *)(ctx + 0x970)
                                                  );
                      if (pcVar18 == (char *)0x0) {
                        *(undefined4 *)(ctx + 4) = 1;
                        if (iVar7 != (int)uVar21) goto LAB_00132919;
                        break;
                      }
                      memcpy(pcVar18,pIVar1->token,(ulong)pIVar1->tokenlen);
                      pcVar18[pIVar1->tokenlen] = '\0';
                      local_e0[uVar21] = pcVar18;
                      if (((long)uVar21 < (long)(iVar7 + -1)) &&
                         (lexer(pIVar1), pIVar1->tokenval != 0x2c)) {
                        __assert_fail("state->tokenval == ((Token) \',\')",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                      ,0x40c,"void handle_pp_define(Context *)");
                      }
                    }
                    lexer(pIVar1);
                    if (pIVar1->tokenval != 0x29) {
                      __assert_fail("state->tokenval == ((Token) \')\')",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                    ,0x417,"void handle_pp_define(Context *)");
                    }
                  }
                  lexer(pIVar1);
LAB_00132676:
                  pushback(pIVar1);
                  buffer = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
                  pIVar1->report_whitespace = 1;
                  do {
                    bVar24 = true;
LAB_001326a6:
                    do {
                      if ((!bVar24) || (*(int *)(ctx + 4) != 0)) {
                        pIVar1->report_whitespace = 0;
                        sVar12 = buffer_size(buffer);
                        if (*(int *)(ctx + 4) == 0) {
                          local_e8 = buffer_flatten(buffer);
                        }
                        else {
                          local_e8 = (char *)0x0;
                        }
                        buffer_destroy(buffer);
                        if (*(int *)(ctx + 4) != 0) goto LAB_001329d6;
                        uVar16 = sVar12 + 1;
                        if (2 < uVar16) {
                          bVar4 = true;
                          if ((*local_e8 == '#') && (local_e8[1] == '#')) {
                            uVar16 = sVar12 - 1;
                            memmove(local_e8,local_e8 + 2,uVar16);
                            if (2 < uVar16) {
                              bVar4 = false;
                              goto LAB_001328d6;
                            }
                          }
                          else {
LAB_001328d6:
                            pcVar18 = local_e8 + (uVar16 - 2);
                            if ((((*pcVar18 == ' ') &&
                                 (pcVar18 = local_e8 + (uVar16 - 3), 0xfffffffffffffffc < uVar16 - 4
                                 )) || (*pcVar18 != '#')) || (pcVar18[-1] != '#')) {
                              if (bVar4) goto LAB_00132933;
                            }
                            else {
                              pcVar18[-1] = '\0';
                            }
                          }
                          fail((Context_conflict1 *)ctx,
                               "\'##\' cannot appear at either end of a macro expansion");
                        }
LAB_00132933:
                        if (bVar24) {
                          __assert_fail("done",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                        ,0x461,"void handle_pp_define(Context *)");
                        }
                        bVar5 = hash_define(__s1);
                        pPVar22 = ctx + (ulong)bVar5 * 8 + 0x130;
                        pPVar23 = pPVar22;
                        goto LAB_0013295b;
                      }
                      TVar6 = lexer(pIVar1);
                      bVar24 = false;
                    } while (TVar6 == 10);
                    if (TVar6 == 0x20) {
                      sVar12 = buffer_size(buffer);
                      if (sVar12 == 0) {
                        __assert_fail("buffer_size(buffer) > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                      ,0x432,"void handle_pp_define(Context *)");
                      }
                      pcVar18 = " ";
                      sVar12 = 1;
                      goto LAB_0013270e;
                    }
                    if ((TVar6 == TOKEN_INCOMPLETE_COMMENT) || (TVar6 == TOKEN_EOI)) {
                      pushback(pIVar1);
                      bVar24 = false;
                      goto LAB_001326a6;
                    }
                    pcVar18 = pIVar1->token;
                    sVar12 = (size_t)pIVar1->tokenlen;
LAB_0013270e:
                    buffer_append(buffer,pcVar18,sVar12);
                  } while( true );
                }
                fail((Context_conflict1 *)ctx,"syntax error in macro parameter list");
LAB_00132916:
                local_e0 = (char **)0x0;
LAB_00132919:
                local_e8 = (char *)0x0;
                goto LAB_001329d6;
              }
              (**(code **)(ctx + 0x968))(__s1,*(undefined8 *)(ctx + 0x970));
              fail((Context_conflict1 *)ctx,"\'defined\' cannot be used as a macro name");
            }
          }
          else {
            fail((Context_conflict1 *)ctx,"Macro names must be identifiers");
          }
          goto LAB_0013207f;
        case TOKEN_PP_UNDEF:
          handle_pp_undef((Context_conflict1 *)ctx);
          goto LAB_0013207f;
        case TOKEN_PP_IF:
        case TOKEN_PP_IFDEF:
        case TOKEN_PP_IFNDEF:
        case TOKEN_PP_ELSE:
        case TOKEN_PP_ELIF:
        case TOKEN_PP_ENDIF:
          goto switchD_001320e5_caseD_124;
        case TOKEN_PP_ERROR:
          pIVar1 = *(IncludeState **)(ctx + 0x120);
          *(undefined4 *)(ctx + 0xb) = 0x726f72;
          *(undefined4 *)__s = 0x72726523;
          pIVar1->report_whitespace = 1;
          pPVar22 = ctx + 0xe;
          uVar15 = 0xf9;
          while( true ) {
            while (uVar8 = uVar15, TVar6 = lexer(pIVar1), TVar6 == 0x20) {
              uVar15 = 0;
              if (uVar8 != 0) {
                *pPVar22 = (Preprocessor)0x20;
                pPVar22 = pPVar22 + 1;
                uVar15 = uVar8 - 1;
              }
            }
            if ((TVar6 == TOKEN_INCOMPLETE_COMMENT) || (TVar6 == TOKEN_EOI)) goto LAB_001324e9;
            if (TVar6 == 10) break;
            uVar15 = pIVar1->tokenlen;
            if ((int)uVar8 < (int)pIVar1->tokenlen) {
              uVar15 = uVar8;
            }
            if (uVar15 == 0) {
              sVar14 = 0;
            }
            else {
              sVar14 = (size_t)(int)uVar15;
              memcpy(pPVar22,pIVar1->token,sVar14);
            }
            pPVar22 = pPVar22 + sVar14;
            uVar15 = uVar8 - uVar15;
          }
          pIVar1->line = pIVar1->line - 1;
LAB_001324e9:
          pushback(pIVar1);
          *pPVar22 = (Preprocessor)0x0;
          pIVar1->report_whitespace = 0;
          *(undefined4 *)ctx = 1;
          goto LAB_0013207f;
        case TOKEN_PP_PRAGMA:
          uVar10 = 1;
          break;
        default:
          if (TVar6 != 10) {
            if ((TVar6 != TOKEN_IDENTIFIER) ||
               (iVar7 = handle_pp_identifier((Context_conflict1 *)ctx), iVar7 == 0))
            goto switchD_001320e5_caseD_124;
            goto LAB_0013207f;
          }
          if (*(int *)(ctx + 0x110) == 0) goto LAB_0013207f;
          uVar10 = 0;
        }
        *(undefined4 *)(ctx + 0x110) = uVar10;
switchD_001320e5_caseD_124:
        *token = TVar6;
        *len = pIVar1->tokenlen;
        return pIVar1->token;
      }
      goto LAB_0013207f;
    }
    *(undefined4 *)(ctx + 0x108) = 0;
    switch(TVar6) {
    case TOKEN_EOI:
      if (pIVar1->bytes_left != 0) {
        __assert_fail("state->bytes_left == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x7f7,
                      "const char *_preprocessor_nexttoken(Preprocessor *, unsigned int *, Token *)"
                     );
      }
      if (pIVar1->conditional_stack == (Conditional *)0x0) {
        pop_source((Context_conflict1 *)ctx);
      }
      else {
        lVar17 = *(long *)(ctx + 0x120);
        piVar2 = *(int **)(lVar17 + 0x50);
        if (4 < *piVar2 - 0x124U) {
          __assert_fail("0 && \"Shouldn\'t hit this case\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x7c2,"void unterminated_pp_condition(Context *)");
        }
        fail((Context_conflict1 *)ctx,
             &DAT_00147854 + *(int *)(&DAT_00147854 + (ulong)(*piVar2 - 0x124U) * 4));
        *(undefined8 *)(lVar17 + 0x50) = *(undefined8 *)(piVar2 + 4);
        *(undefined8 *)(piVar2 + 4) = *(undefined8 *)(ctx + 0x118);
        *(int **)(ctx + 0x118) = piVar2;
      }
      break;
    default:
      goto switchD_00132114_caseD_11e;
    case TOKEN_PP_IF:
      lVar17 = *(long *)(ctx + 0x120);
      iVar7 = reduce_pp_expression((Context_conflict1 *)ctx);
      if (iVar7 != -1) {
        pCVar11 = get_conditional((Context_conflict1 *)ctx);
        if (pCVar11 == (Conditional *)0x0) {
          if (*(int *)(ctx + 4) == 0) {
            __assert_fail("(conditional != NULL) || (ctx->out_of_memory)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x765,"Conditional *handle_pp_if(Context *)");
          }
        }
        else {
          pCVar3 = *(Conditional **)(lVar17 + 0x50);
          if ((pCVar3 == (Conditional *)0x0) || (uVar15 = 1, pCVar3->skipping == 0)) {
            uVar15 = (uint)(iVar7 == 0);
          }
          pCVar11->type = TOKEN_PP_IF;
          pCVar11->linenum = *(int *)(lVar17 + 0x4c) + -1;
          pCVar11->skipping = uVar15;
          pCVar11->chosen = iVar7;
          pCVar11->next = pCVar3;
          *(Conditional **)(lVar17 + 0x50) = pCVar11;
        }
      }
      break;
    case TOKEN_PP_IFDEF:
      _handle_pp_ifdef((Context_conflict1 *)ctx,TOKEN_PP_IFDEF);
      break;
    case TOKEN_PP_IFNDEF:
      _handle_pp_ifdef((Context_conflict1 *)ctx,TOKEN_PP_IFNDEF);
      break;
    case TOKEN_PP_ELSE:
      pCVar11 = (*(IncludeState **)(ctx + 0x120))->conditional_stack;
      iVar7 = require_newline(*(IncludeState **)(ctx + 0x120));
      if (iVar7 == 0) {
        fail((Context_conflict1 *)ctx,"Invalid #else directive");
      }
      else if (pCVar11 == (Conditional *)0x0) {
        fail((Context_conflict1 *)ctx,"#else without #if");
      }
      else if (pCVar11->type == TOKEN_PP_ELSE) {
        fail((Context_conflict1 *)ctx,"#else after #else");
      }
      else {
        pCVar11->type = TOKEN_PP_ELSE;
        if ((pCVar11->next == (Conditional *)0x0) || (pCVar11->next->skipping == 0)) {
          iVar7 = pCVar11->chosen;
          uVar15 = (uint)(iVar7 != 0);
        }
        else {
          iVar7 = pCVar11->chosen;
          uVar15 = 1;
        }
        pCVar11->skipping = uVar15;
        if (iVar7 == 0) {
          pCVar11->chosen = 1;
        }
      }
      break;
    case TOKEN_PP_ELIF:
      iVar7 = reduce_pp_expression((Context_conflict1 *)ctx);
      if (iVar7 != -1) {
        piVar2 = *(int **)(*(long *)(ctx + 0x120) + 0x50);
        if (piVar2 != (int *)0x0) {
          if (*piVar2 == 0x127) {
            fail((Context_conflict1 *)ctx,"#elif after #else");
            break;
          }
          *piVar2 = 0x128;
          if ((*(long *)(piVar2 + 4) == 0) || (*(int *)(*(long *)(piVar2 + 4) + 8) == 0)) {
            if (piVar2[3] != 0) {
              piVar2[2] = 1;
              break;
            }
            piVar2[2] = (uint)(iVar7 == 0);
          }
          else {
            piVar2[2] = 1;
            if (piVar2[3] != 0) break;
          }
          piVar2[3] = iVar7;
          break;
        }
        fail((Context_conflict1 *)ctx,"#elif without #if");
      }
      break;
    case TOKEN_PP_ENDIF:
      pIVar1 = *(IncludeState **)(ctx + 0x120);
      pCVar11 = pIVar1->conditional_stack;
      iVar7 = require_newline(pIVar1);
      if (iVar7 == 0) {
        fail((Context_conflict1 *)ctx,"Invalid #endif directive");
      }
      else if (pCVar11 == (Conditional *)0x0) {
        fail((Context_conflict1 *)ctx,"Unmatched #endif");
      }
      else {
        pIVar1->conditional_stack = pCVar11->next;
        pCVar11->next = *(Conditional **)(ctx + 0x118);
        *(Conditional **)(ctx + 0x118) = pCVar11;
      }
      break;
    case TOKEN_INCOMPLETE_COMMENT:
      fail((Context_conflict1 *)ctx,"Incomplete multiline comment");
    }
  } while( true );
  while( true ) {
    iVar9 = strcmp((char *)*puVar20,__s1);
    pPVar23 = (Preprocessor *)(puVar20 + 5);
    if (iVar9 == 0) break;
LAB_0013295b:
    puVar20 = *(undefined8 **)pPVar23;
    if (puVar20 == (undefined8 *)0x0) {
      pDVar13 = get_define((Context_conflict1 *)ctx);
      if (pDVar13 == (Define *)0x0) goto LAB_001329d6;
      pDVar13->definition = local_e8;
      pDVar13->original = (char *)0x0;
      pDVar13->identifier = __s1;
      pDVar13->parameters = local_e0;
      pDVar13->paramcount = iVar7;
      pDVar13->next = *(Define **)pPVar22;
      *(Define **)pPVar22 = pDVar13;
      goto LAB_0013207f;
    }
  }
  failf((Context_conflict1 *)ctx,"\'%s\' already defined",__s1);
LAB_001329d6:
  (**(code **)(ctx + 0x968))(__s1,*(undefined8 *)(ctx + 0x970));
  (**(code **)(ctx + 0x968))(local_e8,*(undefined8 *)(ctx + 0x970));
  if (local_e0 != (char **)0x0) {
    lVar17 = (long)iVar7;
    while (bVar24 = lVar17 != 0, lVar17 = lVar17 + -1, bVar24) {
      (**(code **)(ctx + 0x968))(local_e0[lVar17],*(undefined8 *)(ctx + 0x970));
    }
  }
  (**(code **)(ctx + 0x968))(local_e0,*(undefined8 *)(ctx + 0x970));
  goto LAB_0013207f;
}

Assistant:

const char *preprocessor_nexttoken(Preprocessor *ctx, unsigned int *len,
                                   Token *token)
{
    const char *retval = _preprocessor_nexttoken(ctx, len, token);
    print_debug_token(retval, *len, *token);
    return retval;
}